

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_registrars.hpp
# Opt level: O0

void __thiscall
Catch::ReporterRegistrar<Catch::CompactReporter>::ReporterRegistrar
          (ReporterRegistrar<Catch::CompactReporter> *this,string *name)

{
  string *psVar1;
  IMutableRegistryHub *pIVar2;
  ReporterFactory *this_00;
  Ptr<Catch::IReporterFactory> local_20;
  string *local_18;
  string *name_local;
  ReporterRegistrar<Catch::CompactReporter> *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  pIVar2 = getMutableRegistryHub();
  psVar1 = local_18;
  this_00 = (ReporterFactory *)operator_new(0x10);
  (this_00->super_SharedImpl<Catch::IReporterFactory>).super_IReporterFactory.super_IShared.
  super_NonCopyable._vptr_NonCopyable = (_func_int **)0x0;
  *(undefined8 *)&(this_00->super_SharedImpl<Catch::IReporterFactory>).m_rc = 0;
  ReporterFactory::ReporterFactory(this_00);
  Ptr<Catch::IReporterFactory>::Ptr(&local_20,(IReporterFactory *)this_00);
  (*pIVar2->_vptr_IMutableRegistryHub[2])(pIVar2,psVar1,&local_20);
  Ptr<Catch::IReporterFactory>::~Ptr(&local_20);
  return;
}

Assistant:

ReporterRegistrar( std::string const& name ) {
            getMutableRegistryHub().registerReporter( name, new ReporterFactory() );
        }